

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_8x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  int8_t *piVar3;
  undefined7 in_register_00000009;
  long lVar4;
  long lVar5;
  int i;
  ulong uVar6;
  __m128i in [64];
  
  piVar3 = av1_fwd_txfm_shift_ls[0xf];
  uVar6 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar1 = *(code **)((long)col_highbd_txfm8x32_arr + uVar6);
  pcVar2 = *(code **)((long)row_highbd_txfm32x8_arr + uVar6);
  load_buffer_8x16(input,in,stride,0,0,(int)*av1_fwd_txfm_shift_ls[0xf]);
  load_buffer_8x16(input + (stride << 4),in + 0x20,stride,0,0,(int)*piVar3);
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 0x10) {
    lVar4 = (long)in[0] + lVar5;
    (*pcVar1)(lVar4,lVar4,0xc,2);
  }
  col_txfm_16x16_rounding(in,-(int)piVar3[1]);
  transpose_8nx8n(in,(__m128i *)coeff,8,0x20);
  for (uVar6 = 0; uVar6 < 8; uVar6 = uVar6 + 2) {
    (*pcVar2)(coeff,coeff,0xc,8);
    coeff = coeff + 8;
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_8x32_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[64];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X32];
  const int txw_idx = get_txw_idx(TX_8X32);
  const int txh_idx = get_txh_idx(TX_8X32);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x32_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm32x8_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  const int txfm_size_col = tx_size_wide[TX_8X32];
  const int txfm_size_row = tx_size_high[TX_8X32];
  const int num_col = txfm_size_col >> 2;

  // column transform
  load_buffer_8x16(input, in, stride, 0, 0, shift[0]);
  load_buffer_8x16(input + (txfm_size_row >> 1) * stride, in + txfm_size_row,
                   stride, 0, 0, shift[0]);

  for (int i = 0; i < num_col; i++) {
    col_txfm((in + i), (in + i), bitcol, num_col);
  }
  col_txfm_16x16_rounding(in, -shift[1]);
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < txfm_size_col; i += 2) {
    row_txfm((outcoef128 + i), (outcoef128 + i), bitrow, txfm_size_col);
  }
  (void)bd;
}